

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

int vs_byte(bitstream *str)

{
  byte bVar1;
  int iVar2;
  uint8_t *puVar3;
  int iVar4;
  long lVar5;
  char *__format;
  
  if (str->dir == VS_ENCODE) {
    switch(str->type) {
    case VS_H261:
    case VS_H263:
      break;
    case VS_H262:
      if ((str->curbyte < 2) && (1 < str->zero_bytes)) {
        __format = "00 00 0%d emitted!\n";
        goto LAB_001041cc;
      }
      break;
    case VS_H264:
      if ((str->curbyte < 4) && (str->zero_bytes == 2)) {
        iVar2 = str->bytesmax;
        if (iVar2 <= str->bytesnum) {
          iVar4 = 0x10;
          if (iVar2 != 0) {
            iVar4 = iVar2 * 2;
          }
          str->bytesmax = iVar4;
          puVar3 = (uint8_t *)realloc(str->bytes,(long)iVar4);
          str->bytes = puVar3;
        }
        iVar2 = str->bytesnum;
        str->bytesnum = iVar2 + 1;
        str->bytes[iVar2] = '\x03';
        str->zero_bytes = 0;
      }
      break;
    default:
      goto switchD_00104034_default;
    }
    iVar2 = str->bytesmax;
    if (iVar2 <= str->bytesnum) {
      iVar4 = 0x10;
      if (iVar2 != 0) {
        iVar4 = iVar2 * 2;
      }
      str->bytesmax = iVar4;
      puVar3 = (uint8_t *)realloc(str->bytes,(long)iVar4);
      str->bytes = puVar3;
    }
    iVar2 = str->bytesnum;
    str->bytesnum = iVar2 + 1;
    str->bytes[iVar2] = str->curbyte;
    iVar2 = 0;
    if (str->curbyte == '\0') {
      iVar2 = str->zero_bytes + 1;
    }
    str->zero_bytes = iVar2;
    str->curbyte = '\0';
    goto LAB_001040bd;
  }
  iVar2 = str->bytepos;
  if (str->bytesnum <= iVar2) {
    vs_byte_cold_1();
    return 1;
  }
  lVar5 = (long)iVar2 + 1;
  iVar4 = (int)lVar5;
  str->bytepos = iVar4;
  bVar1 = str->bytes[iVar2];
  str->curbyte = bVar1;
  switch(str->type) {
  case VS_H261:
  case VS_H263:
    break;
  case VS_H262:
    if ((bVar1 < 2) && (1 < str->zero_bytes)) {
LAB_001040f6:
      __format = "00 00 0%d read in a NAL!\n";
LAB_001041cc:
      fprintf(_stderr,__format);
      return 1;
    }
    break;
  case VS_H264:
    if (str->zero_bytes == 2) {
      if (bVar1 == 3) {
        if (str->bytesnum <= iVar4) {
          vs_byte_cold_2();
          return 1;
        }
        str->zero_bytes = 0;
        str->bytepos = iVar2 + 2;
        bVar1 = str->bytes[lVar5];
        str->curbyte = bVar1;
        if (3 < bVar1) {
          __format = "Invalid escape sequence: 00 00 03 %02x!\n";
          goto LAB_001041cc;
        }
      }
      else if (bVar1 < 3) goto LAB_001040f6;
    }
    break;
  default:
switchD_00104034_default:
    abort();
  }
  iVar2 = 0;
  if (str->curbyte == '\0') {
    iVar2 = str->zero_bytes + 1;
  }
  str->zero_bytes = iVar2;
  str->hasbyte = 1;
LAB_001040bd:
  str->bitpos = 7;
  return 0;
}

Assistant:

int vs_byte(struct bitstream *str) {
	if (str->dir == VS_ENCODE) {
		switch (str->type) {
			case VS_H262:
				if (str->curbyte < 2 && str->zero_bytes >= 2) {
					fprintf(stderr, "00 00 0%d emitted!\n", str->curbyte);
					return 1;
				}
				break;
			case VS_H264:
				if (str->curbyte < 4 && str->zero_bytes == 2) {
					/* escape */
					ADDARRAY(str->bytes, 3);
					str->zero_bytes = 0;
				}
				break;
			case VS_H261:
			case VS_H263:
				/* start codes not byte-oriented in these */
				break;
			default:
				abort();
		}
		ADDARRAY(str->bytes, str->curbyte);
		if (!str->curbyte)
			str->zero_bytes++;
		else
			str->zero_bytes = 0;
		str->curbyte = 0;
	} else {
		if (str->bytepos >= str->bytesnum) {
			fprintf(stderr, "End of bitstream in a NAL!\n");
			return 1;
		}
		str->curbyte = str->bytes[str->bytepos++];
		switch (str->type) {
			case VS_H262:
				if (str->curbyte < 2 && str->zero_bytes >= 2) {
					fprintf(stderr, "00 00 0%d read in a NAL!\n", str->curbyte);
					return 1;
				}
				break;
			case VS_H264:
				if (str->zero_bytes == 2) {
					switch (str->curbyte) {
						case 0:
						case 1:
						case 2:
							fprintf(stderr, "00 00 0%d read in a NAL!\n", str->curbyte);
							return 1;
						case 3:
							if (str->bytepos >= str->bytesnum) {
								fprintf(stderr, "End of bitstream in a NAL!\n");
								return 1;
							}
							str->zero_bytes = 0;
							str->curbyte = str->bytes[str->bytepos++];
							if (str->curbyte > 3) {
								fprintf(stderr, "Invalid escape sequence: 00 00 03 %02x!\n", str->curbyte);
								return 1;
							}
							break;
					}
				}
				break;
			case VS_H261:
			case VS_H263:
				/* start codes not byte-oriented in these */
				break;
			default:
				abort();
		}
		if (!str->curbyte)
			str->zero_bytes++;
		else
			str->zero_bytes = 0;
		str->hasbyte = 1;
	}
	str->bitpos = 7;
	return 0;
}